

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileForeach(jx9_gen_state *pGen)

{
  uint uVar1;
  SyToken *pSVar2;
  jx9_vm *pjVar3;
  SySet *pSVar4;
  GenBlock *pBlock;
  int iVar5;
  sxi32 sVar6;
  undefined8 *p3;
  ulong uVar7;
  sxu32 sVar8;
  char *pcVar9;
  SyToken *pSVar10;
  SyToken *pSVar11;
  SyToken *pSVar12;
  long lVar13;
  bool bVar14;
  GenBlock *pForeachBlock;
  sxu32 nFalseJump;
  GenBlock *local_50;
  sxu32 local_44;
  SyToken *local_40;
  undefined4 local_38;
  sxu32 local_34;
  
  local_50 = (GenBlock *)0x0;
  pSVar12 = pGen->pIn;
  sVar8 = pSVar12->nLine;
  pGen->pIn = pSVar12 + 1;
  if ((pGen->pEnd <= pSVar12 + 1) || ((pSVar12[1].nType & 0x200) == 0)) {
    iVar5 = jx9GenCompileError(pGen,1,sVar8,"foreach: Expected \'(\'");
    goto LAB_00125c6b;
  }
  pGen->pIn = pSVar12 + 2;
  sVar6 = GenStateEnterBlock(pGen,1,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&local_50);
  if (sVar6 != 0) {
    return -10;
  }
  pSVar12 = pGen->pIn;
  pSVar2 = pGen->pEnd;
  pSVar10 = pSVar12;
  if (pSVar2 <= pSVar12) {
LAB_00125e94:
    sVar6 = jx9GenCompileError(pGen,1,sVar8,"foreach: Missing expression");
    if (sVar6 != -10) {
      pGen->pIn = pSVar10;
      if (pSVar10 < pGen->pEnd) {
        pGen->pIn = pSVar10 + 1;
      }
      return 0;
    }
    return -10;
  }
  iVar5 = 1;
  lVar13 = 0;
  do {
    uVar1 = *(uint *)((long)&pSVar12->nType + lVar13);
    if ((uVar1 >> 9 & 1) == 0) {
      if ((uVar1 >> 10 & 1) != 0) {
        if (iVar5 < 2) {
          if (lVar13 == 0) goto LAB_00125e94;
          break;
        }
        iVar5 = iVar5 + -1;
      }
    }
    else {
      iVar5 = iVar5 + 1;
    }
    pSVar11 = (SyToken *)((long)&pSVar12[1].sData.zString + lVar13);
    lVar13 = lVar13 + 0x20;
  } while (pSVar11 < pSVar2);
  pSVar10 = (SyToken *)((long)&(pSVar12->sData).zString + lVar13);
  if (pSVar2 <= pSVar10) goto LAB_00125e94;
  pSVar11 = pSVar12;
  if (pSVar12 < pSVar10) {
    do {
      if (((pSVar11->nType & 4) != 0) && (*(int *)&pSVar11->pUserData == 0xb)) break;
      pSVar11 = pSVar11 + 1;
    } while (pSVar11 < pSVar10);
    if (pSVar11 <= pSVar12) goto LAB_00125ed8;
    pGen->pEnd = pSVar11;
    sVar6 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if (sVar6 == -10) {
      return -10;
    }
    pSVar12 = pGen->pIn;
    while (pSVar12 < pSVar11) {
      sVar6 = jx9GenCompileError(pGen,1,pSVar12->nLine,"foreach: Unexpected token \'%z\'");
      if (sVar6 == -10) {
        return -10;
      }
      pSVar12 = pGen->pIn + 1;
      pGen->pIn = pSVar12;
    }
    pSVar12 = pSVar11 + 1;
    pGen->pIn = pSVar12;
    if ((pSVar10 <= pSVar12) &&
       (sVar6 = jx9GenCompileError(pGen,1,pSVar11[1].nLine,"foreach: Missing $key => $value pair"),
       sVar6 == -10)) {
      return -10;
    }
    local_40 = pSVar12;
    p3 = (undefined8 *)SyMemBackendAlloc(&pGen->pVm->sAllocator,0x50);
    if (p3 == (undefined8 *)0x0) {
      jx9GenCompileError(pGen,1,pGen->pIn->nLine,"Fatal, JX9 engine is running out-of-memory");
      return -10;
    }
    uVar7 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)p3 + uVar7 + 4) = 0;
      uVar7 = uVar7 + 4;
    } while (uVar7 < 0x4c);
    pjVar3 = pGen->pVm;
    *(undefined4 *)(p3 + 7) = 0;
    *(undefined4 *)((long)p3 + 0x3c) = 0;
    *(undefined4 *)(p3 + 8) = 8;
    *(undefined4 *)((long)p3 + 0x44) = 0;
    p3[5] = pjVar3;
    p3[6] = 0;
    p3[9] = 0;
    if (local_40 < pSVar10) {
      pSVar12 = pSVar11 + 2;
      do {
        if ((pSVar12[-1].nType & 0x20000) != 0) {
          if (pGen->pIn < pSVar12 + -1) {
            pGen->pEnd = pSVar12 + -1;
            sVar6 = jx9CompileExpr(pGen,0,GenStateForEachNodeValidator);
            if (sVar6 == -10) {
              return -10;
            }
            pSVar4 = pGen->pVm->pByteContainer;
            sVar8 = pSVar4->nUsed - 1;
            pSVar4->nUsed = sVar8;
            pcVar9 = *(char **)((long)pSVar4->pBase + (ulong)(sVar8 * pSVar4->eSize) + 0x10);
            if (pcVar9 != (char *)0x0) {
              *p3 = pcVar9;
              sVar8 = SyStrlen(pcVar9);
              *(sxu32 *)(p3 + 1) = sVar8;
            }
            *(byte *)(p3 + 4) = *(byte *)(p3 + 4) | 1;
          }
          else {
            sVar6 = jx9GenCompileError(pGen,1,pGen->pIn->nLine,"foreach: Missing $key");
            if (sVar6 == -10) {
              return -10;
            }
          }
          pGen->pIn = pSVar12;
          break;
        }
        bVar14 = pSVar12 < pSVar10;
        pSVar12 = pSVar12 + 1;
      } while (bVar14);
    }
    pGen->pEnd = pSVar10;
    if (pGen->pIn < pSVar10) {
      sVar6 = jx9CompileExpr(pGen,0,GenStateForEachNodeValidator);
      if (sVar6 == -10) {
        return -10;
      }
      pjVar3 = pGen->pVm;
      pSVar4 = pjVar3->pByteContainer;
      sVar8 = pSVar4->nUsed - 1;
      pSVar4->nUsed = sVar8;
      pcVar9 = *(char **)((long)pSVar4->pBase + (ulong)(sVar8 * pSVar4->eSize) + 0x10);
      if (pcVar9 != (char *)0x0) {
        p3[2] = pcVar9;
        sVar8 = SyStrlen(pcVar9);
        *(sxu32 *)(p3 + 3) = sVar8;
      }
      jx9VmEmitInstr(pjVar3,0x43,0,0,p3,&local_44);
      local_38 = 0x43;
      local_34 = local_44;
      SySetPut(&local_50->aJumpFix,&local_38);
      pjVar3 = pGen->pVm;
      local_50->nFirstInstr = pjVar3->pByteContainer->nUsed;
      jx9VmEmitInstr(pjVar3,0x44,0,0,p3,&local_44);
      local_38 = 0x44;
      local_34 = local_44;
      SySetPut(&local_50->aJumpFix,&local_38);
      pGen->pIn = pSVar10 + 1;
      pGen->pEnd = pSVar2;
      sVar6 = jx9CompileBlock(pGen);
      if (sVar6 != -10) {
        jx9VmEmitInstr(pGen->pVm,8,0,local_50->nFirstInstr,(void *)0x0,(sxu32 *)0x0);
        GenStateFixJumps(local_50,-1,pGen->pVm->pByteContainer->nUsed);
        pBlock = pGen->pCurrent;
        if (pBlock == (GenBlock *)0x0) {
          return 0;
        }
        pGen->pCurrent = pBlock->pParent;
        GenStateFreeBlock(pBlock);
        return 0;
      }
      return -10;
    }
    sVar8 = pGen->pIn->nLine;
    pcVar9 = "foreach: Missing $value";
  }
  else {
LAB_00125ed8:
    sVar8 = pSVar12->nLine;
    pcVar9 = "foreach: Missing array/object expression";
  }
  iVar5 = jx9GenCompileError(pGen,1,sVar8,pcVar9);
LAB_00125c6b:
  if (iVar5 == -10) {
    return -10;
  }
  pSVar12 = pGen->pIn;
  while( true ) {
    if (pGen->pEnd <= pSVar12) {
      return 0;
    }
    if ((pSVar12->nType & 0x40040) != 0) break;
    pGen->pIn = pSVar12 + 1;
    pSVar12 = pSVar12 + 1;
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileForeach(jx9_gen_state *pGen)
{ 
	SyToken *pCur, *pTmp, *pEnd = 0;
	GenBlock *pForeachBlock = 0;
	jx9_foreach_info *pInfo;
	sxu32 nFalseJump;
	VmInstr *pInstr;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'foreach' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "foreach: Expected '('");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP, jx9VmInstrLength(pGen->pVm), 0, &pForeachBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Delimit the expression */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "foreach: Missing expression");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		/* Synchronize */
		pGen->pIn = pEnd;
		if( pGen->pIn < pGen->pEnd ){
			pGen->pIn++;
		}
		return SXRET_OK;
	}
	/* Compile the array expression */
	pCur = pGen->pIn;
	while( pCur < pEnd ){
		if( pCur->nType & JX9_TK_KEYWORD ){
			sxi32 nKeywrd = SX_PTR_TO_INT(pCur->pUserData);
			if( nKeywrd == JX9_TKWRD_AS ){
				/* Break with the first 'as' found */
				break;
			}
		}
		/* Advance the stream cursor */
		pCur++;
	}
	if( pCur <= pGen->pIn ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, 
			"foreach: Missing array/object expression");
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pCur;
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}
	/* Update token stream */
	while(pGen->pIn < pCur ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pCur++; /* Jump the 'as' keyword */
	pGen->pIn = pCur; 
	if( pGen->pIn >= pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Missing $key => $value pair");
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
	}
	/* Create the foreach context */
	pInfo = (jx9_foreach_info *)SyMemBackendAlloc(&pGen->pVm->sAllocator, sizeof(jx9_foreach_info));
	if( pInfo == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Fatal, JX9 engine is running out-of-memory");
		return SXERR_ABORT;
	}
	/* Zero the structure */
	SyZero(pInfo, sizeof(jx9_foreach_info));
	/* Initialize structure fields */
	SySetInit(&pInfo->aStep, &pGen->pVm->sAllocator, sizeof(jx9_foreach_step *));
	/* Check if we have a key field */
	while( pCur < pEnd && (pCur->nType & JX9_TK_COMMA) == 0 ){
		pCur++;
	}
	if( pCur < pEnd ){
		/* Compile the expression holding the key name */
		if( pGen->pIn >= pCur ){
			rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Missing $key");
			if( rc == SXERR_ABORT ){
				/* Don't worry about freeing memory, everything will be released shortly */
				return SXERR_ABORT;
			}
		}else{
			pGen->pEnd = pCur;
			rc = jx9CompileExpr(&(*pGen), 0, GenStateForEachNodeValidator);
			if( rc == SXERR_ABORT ){
				/* Don't worry about freeing memory, everything will be released shortly */
				return SXERR_ABORT;
			}
			pInstr = jx9VmPopInstr(pGen->pVm);
			if( pInstr->p3 ){
				/* Record key name */
				SyStringInitFromBuf(&pInfo->sKey, pInstr->p3, SyStrlen((const char *)pInstr->p3));
			}
			pInfo->iFlags |= JX9_4EACH_STEP_KEY;
		}
		pGen->pIn = &pCur[1]; /* Jump the arrow */
	}
	pGen->pEnd = pEnd;
	if( pGen->pIn >= pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "foreach: Missing $value");
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Compile the expression holding the value name */
	rc = jx9CompileExpr(&(*pGen), 0, GenStateForEachNodeValidator);
	if( rc == SXERR_ABORT ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return SXERR_ABORT;
	}
	pInstr = jx9VmPopInstr(pGen->pVm);
	if( pInstr->p3 ){
		/* Record value name */
		SyStringInitFromBuf(&pInfo->sValue, pInstr->p3, SyStrlen((const char *)pInstr->p3));
	}
	/* Emit the 'FOREACH_INIT' instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_FOREACH_INIT, 0, 0, pInfo, &nFalseJump);
	/* Save the instruction index so we can fix it later when the jump destination is resolved */
	GenStateNewJumpFixup(pForeachBlock, JX9_OP_FOREACH_INIT, nFalseJump);
	/* Record the first instruction to execute */
	pForeachBlock->nFirstInstr = jx9VmInstrLength(pGen->pVm);
	/* Emit the FOREACH_STEP instruction */
    jx9VmEmitInstr(pGen->pVm, JX9_OP_FOREACH_STEP, 0, 0, pInfo, &nFalseJump);
	/* Save the instruction index so we can fix it later when the jump destination is resolved */
	GenStateNewJumpFixup(pForeachBlock, JX9_OP_FOREACH_STEP, nFalseJump);
	/* Compile the loop body */
	pGen->pIn = &pEnd[1];
	pGen->pEnd = pTmp;
	rc = jx9CompileBlock(&(*pGen));
	if( rc == SXERR_ABORT ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return SXERR_ABORT;
	}
	/* Emit the unconditional jump to the start of the loop */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pForeachBlock->nFirstInstr, 0, 0);
	/* Fix all jumps now the destination is resolved */
	GenStateFixJumps(pForeachBlock, -1,jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';' so we can avoid 
	 * compiling this erroneous block.
	 */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}